

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctfst.c
# Opt level: O0

void jpeg_fdct_ifast(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  byte *pbVar18;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *dataptr;
  DCTELEM z13;
  DCTELEM z11;
  DCTELEM z5;
  DCTELEM z4;
  DCTELEM z3;
  DCTELEM z2;
  DCTELEM z1;
  DCTELEM tmp13;
  DCTELEM tmp12;
  DCTELEM tmp11;
  DCTELEM tmp10;
  DCTELEM tmp7;
  DCTELEM tmp6;
  DCTELEM tmp5;
  DCTELEM tmp4;
  DCTELEM tmp3;
  DCTELEM tmp2;
  DCTELEM tmp1;
  DCTELEM tmp0;
  JDIMENSION start_col_local;
  JSAMPARRAY sample_data_local;
  DCTELEM *data_local;
  
  dataptr = data;
  for (ctr = 0; ctr < 8; ctr = ctr + 1) {
    pbVar18 = sample_data[ctr] + start_col;
    iVar11 = (uint)*pbVar18 - (uint)pbVar18[7];
    bVar1 = pbVar18[1];
    bVar2 = pbVar18[6];
    bVar3 = pbVar18[1];
    bVar4 = pbVar18[6];
    bVar5 = pbVar18[2];
    bVar6 = pbVar18[5];
    bVar7 = pbVar18[2];
    bVar8 = pbVar18[5];
    bVar9 = pbVar18[3];
    bVar10 = pbVar18[4];
    iVar12 = (uint)*pbVar18 + (uint)pbVar18[7] + (uint)pbVar18[3] + (uint)pbVar18[4];
    iVar13 = ((uint)*pbVar18 + (uint)pbVar18[7]) - ((uint)pbVar18[3] + (uint)pbVar18[4]);
    iVar14 = (uint)bVar1 + (uint)bVar2 + (uint)bVar5 + (uint)bVar6;
    *dataptr = iVar12 + iVar14 + -0x400;
    dataptr[4] = iVar12 - iVar14;
    iVar12 = (int)((ulong)((long)(int)((((uint)bVar1 + (uint)bVar2) - ((uint)bVar5 + (uint)bVar6)) +
                                      iVar13) * 0xb5) >> 8);
    dataptr[2] = iVar13 + iVar12;
    dataptr[6] = iVar13 - iVar12;
    iVar12 = ((uint)bVar9 - (uint)bVar10) + ((uint)bVar7 - (uint)bVar8);
    iVar13 = ((uint)bVar3 - (uint)bVar4) + iVar11;
    iVar14 = (int)((ulong)((long)(iVar12 - iVar13) * 0x62) >> 8);
    iVar12 = (int)((ulong)((long)iVar12 * 0x8b) >> 8) + iVar14;
    iVar14 = (int)((ulong)((long)iVar13 * 0x14e) >> 8) + iVar14;
    iVar13 = (int)((ulong)((long)(int)(((uint)bVar7 - (uint)bVar8) + ((uint)bVar3 - (uint)bVar4)) *
                          0xb5) >> 8);
    iVar15 = iVar11 + iVar13;
    iVar11 = iVar11 - iVar13;
    dataptr[5] = iVar11 + iVar12;
    dataptr[3] = iVar11 - iVar12;
    dataptr[1] = iVar15 + iVar14;
    dataptr[7] = iVar15 - iVar14;
    dataptr = dataptr + 8;
  }
  dataptr = data;
  for (ctr = 7; -1 < ctr; ctr = ctr + -1) {
    iVar16 = *dataptr - dataptr[0x38];
    iVar12 = dataptr[0x30];
    iVar13 = dataptr[0x10];
    iVar14 = dataptr[0x20];
    iVar15 = *dataptr + dataptr[0x38] + dataptr[0x18] + dataptr[0x20];
    iVar11 = (*dataptr + dataptr[0x38]) - (dataptr[0x18] + dataptr[0x20]);
    iVar17 = dataptr[8] + dataptr[0x30] + dataptr[0x10] + dataptr[0x28];
    *dataptr = iVar15 + iVar17;
    dataptr[0x20] = iVar15 - iVar17;
    iVar15 = (int)((ulong)((long)(((dataptr[8] + dataptr[0x30]) - (dataptr[0x10] + dataptr[0x28])) +
                                 iVar11) * 0xb5) >> 8);
    dataptr[0x10] = iVar11 + iVar15;
    dataptr[0x30] = iVar11 - iVar15;
    iVar14 = (dataptr[0x18] - iVar14) + (iVar13 - dataptr[0x28]);
    iVar15 = (dataptr[8] - iVar12) + iVar16;
    iVar11 = (int)((ulong)((long)(iVar14 - iVar15) * 0x62) >> 8);
    iVar14 = (int)((ulong)((long)iVar14 * 0x8b) >> 8) + iVar11;
    iVar11 = (int)((ulong)((long)iVar15 * 0x14e) >> 8) + iVar11;
    iVar12 = (int)((ulong)((long)((iVar13 - dataptr[0x28]) + (dataptr[8] - iVar12)) * 0xb5) >> 8);
    iVar13 = iVar16 + iVar12;
    iVar16 = iVar16 - iVar12;
    dataptr[0x28] = iVar16 + iVar14;
    dataptr[0x18] = iVar16 - iVar14;
    dataptr[8] = iVar13 + iVar11;
    dataptr[0x38] = iVar13 - iVar11;
    dataptr = dataptr + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_ifast (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  DCTELEM tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  DCTELEM tmp10, tmp11, tmp12, tmp13;
  DCTELEM z1, z2, z3, z4, z5, z11, z13;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */

  dataptr = data;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Load data into workspace */
    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[7]);
    tmp7 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[6]);
    tmp6 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[5]);
    tmp5 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[4]);
    tmp4 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[4]);

    /* Even part */

    tmp10 = tmp0 + tmp3;	/* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    /* Apply unsigned->signed conversion */
    dataptr[0] = tmp10 + tmp11 - 8 * CENTERJSAMPLE; /* phase 3 */
    dataptr[4] = tmp10 - tmp11;

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_707106781); /* c4 */
    dataptr[2] = tmp13 + z1;	/* phase 5 */
    dataptr[6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;	/* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = MULTIPLY(tmp10 - tmp12, FIX_0_382683433); /* c6 */
    z2 = MULTIPLY(tmp10, FIX_0_541196100) + z5; /* c2-c6 */
    z4 = MULTIPLY(tmp12, FIX_1_306562965) + z5; /* c2+c6 */
    z3 = MULTIPLY(tmp11, FIX_0_707106781); /* c4 */

    z11 = tmp7 + z3;		/* phase 5 */
    z13 = tmp7 - z3;

    dataptr[5] = z13 + z2;	/* phase 6 */
    dataptr[3] = z13 - z2;
    dataptr[1] = z11 + z4;
    dataptr[7] = z11 - z4;

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns. */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*7];
    tmp7 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*6];
    tmp6 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*5];
    tmp5 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*4];

    /* Even part */

    tmp10 = tmp0 + tmp3;	/* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[DCTSIZE*0] = tmp10 + tmp11; /* phase 3 */
    dataptr[DCTSIZE*4] = tmp10 - tmp11;

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_707106781); /* c4 */
    dataptr[DCTSIZE*2] = tmp13 + z1; /* phase 5 */
    dataptr[DCTSIZE*6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;	/* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = MULTIPLY(tmp10 - tmp12, FIX_0_382683433); /* c6 */
    z2 = MULTIPLY(tmp10, FIX_0_541196100) + z5; /* c2-c6 */
    z4 = MULTIPLY(tmp12, FIX_1_306562965) + z5; /* c2+c6 */
    z3 = MULTIPLY(tmp11, FIX_0_707106781); /* c4 */

    z11 = tmp7 + z3;		/* phase 5 */
    z13 = tmp7 - z3;

    dataptr[DCTSIZE*5] = z13 + z2; /* phase 6 */
    dataptr[DCTSIZE*3] = z13 - z2;
    dataptr[DCTSIZE*1] = z11 + z4;
    dataptr[DCTSIZE*7] = z11 - z4;

    dataptr++;			/* advance pointer to next column */
  }
}